

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int StartUBXThreadubloxx(UBLOX *publox)

{
  int iVar1;
  int local_1c;
  int id;
  UBLOX *publox_local;
  
  local_1c = 0;
  do {
    if ((UBLOX *)addrsublox[local_1c] == publox) {
      resublox[local_1c] = 1;
      bExitUBXublox[local_1c] = 0;
      memset(ubxdataublox,0,0x1b8);
      InitCriticalSection(ubloxCS + local_1c);
      iVar1 = CreateDefaultThread(ubloxUBXThread,publox,ubloxUBXThreadId + local_1c);
      return iVar1;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int StartUBXThreadubloxx(UBLOX* publox)
{
	int id = 0;

	while (addrsublox[id] != publox)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resublox[id] = EXIT_FAILURE;
	bExitUBXublox[id] = FALSE;
	memset(&ubxdataublox, 0, sizeof(UBXDATA));
	InitCriticalSection(&ubloxCS[id]);
	return CreateDefaultThread(ubloxUBXThread, (void*)publox, &ubloxUBXThreadId[id]);
}